

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsonpath_selector.hpp
# Opt level: O3

reference __thiscall
jsoncons::jsonpath::detail::
parent_node_selector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
::evaluate(parent_node_selector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
           *this,eval_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
                 *context,reference root,path_node_type *last,reference param_4,
          result_options options,error_code *ec)

{
  supertype *psVar1;
  bool bVar2;
  int iVar3;
  reference pbVar4;
  undefined4 extraout_var;
  reference pbVar5;
  
  if (0 < this->ancestor_depth_) {
    iVar3 = 1;
    do {
      last = last->parent_;
      if (last == (basic_path_node<char> *)0x0) break;
      bVar2 = iVar3 < this->ancestor_depth_;
      iVar3 = iVar3 + 1;
    } while (bVar2);
    if (last == (basic_path_node<char> *)0x0) goto LAB_003ccf29;
  }
  pbVar4 = select<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>
                     (root,last);
  if (pbVar4 != (basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)0x0) {
    psVar1 = (this->
             super_base_selector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
             ).tail_;
    if (psVar1 != (supertype *)0x0) {
      iVar3 = (*psVar1->_vptr_jsonpath_selector[3])(psVar1,context,root,last,pbVar4,options,ec);
      pbVar4 = (reference)CONCAT44(extraout_var,iVar3);
    }
    return pbVar4;
  }
LAB_003ccf29:
  pbVar5 = eval_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
           ::null_value(context);
  return pbVar5;
}

Assistant:

reference evaluate(eval_context<Json,JsonReference>& context,
                           reference root,
                           const path_node_type& last, 
                           reference, 
                           result_options options,
                           std::error_code& ec) const override
        {
            const path_node_type* ancestor = std::addressof(last);
            int index = 0;
            while (ancestor != nullptr && index < ancestor_depth_)
            {
                ancestor = ancestor->parent();
                ++index;
            }

            if (ancestor != nullptr)
            {
                pointer ptr = jsoncons::jsonpath::select(root, *ancestor);
                if (ptr != nullptr)
                {
                    return this->evaluate_tail(context, root, *ancestor, *ptr, options, ec);
                }
                return context.null_value();
            }
            return context.null_value();
        }